

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O3

double __thiscall chrono::ChSystem::GetSolverTolerance(ChSystem *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar2;
  double dVar3;
  
  peVar1 = (this->solver).super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar3 = 0.0;
  if (peVar1 != (element_type *)0x0) {
    lVar2 = __dynamic_cast(peVar1,&ChSolver::typeinfo,&ChIterativeSolver::typeinfo,
                           0xfffffffffffffffe);
    dVar3 = 0.0;
    if (lVar2 != 0) {
      this_00 = (this->solver).super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        dVar3 = *(double *)(lVar2 + 0x10);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        dVar3 = *(double *)(lVar2 + 0x10);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  return dVar3;
}

Assistant:

double ChSystem::GetSolverTolerance() const {
    if (auto iter_solver = std::dynamic_pointer_cast<ChIterativeSolver>(solver)) {
        return iter_solver->GetTolerance();
    }
    return 0;
}